

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  char *zFormat;
  long in_FS_OFFSET;
  undefined1 auStack_a8 [16];
  long local_98;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pFile->ctrlFlags & 0x80) == 0) {
    memset(auStack_a8,0xaa,0x90);
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,auStack_a8);
    if (iVar1 == 0) {
      if (local_98 == 0) {
        zFormat = "file unlinked while open: %s";
      }
      else if (local_98 == 1) {
        iVar1 = fileHasMoved(pFile);
        if (iVar1 == 0) goto LAB_00133148;
        zFormat = "file renamed while open: %s";
      }
      else {
        zFormat = "multiple links to file: %s";
      }
    }
    else {
      zFormat = "cannot fstat db file %s";
    }
    sqlite3_log(0x1c,zFormat,pFile->zPath);
  }
LAB_00133148:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;

  /* These verifications occurs for the main database only */
  if( pFile->ctrlFlags & UNIXFILE_NOLOCK ) return;

  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    return;
  }
  if( fileHasMoved(pFile) ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    return;
  }
}